

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O0

CDNode * __thiscall dg::DOD::ColoredAp::createNode(ColoredAp *this,CDNode *gnode)

{
  CDNode *this_00;
  mapped_type *ppCVar1;
  mapped_type in_RSI;
  CDNode *nd;
  key_type *in_stack_ffffffffffffffc8;
  CDNode *this_01;
  CDGraph *in_stack_ffffffffffffffe0;
  
  this_00 = CDGraph::createNode(in_stack_ffffffffffffffe0);
  this_01 = this_00;
  ppCVar1 = std::
            unordered_map<dg::CDNode_*,_dg::CDNode_*,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>_>
            ::operator[]((unordered_map<dg::CDNode_*,_dg::CDNode_*,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>_>
                          *)this_00,in_stack_ffffffffffffffc8);
  *ppCVar1 = this_01;
  ppCVar1 = std::
            unordered_map<dg::CDNode_*,_dg::CDNode_*,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>_>
            ::operator[]((unordered_map<dg::CDNode_*,_dg::CDNode_*,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_dg::CDNode_*>_>_>
                          *)this_01,in_stack_ffffffffffffffc8);
  *ppCVar1 = in_RSI;
  return this_00;
}

Assistant:

CDNode *createNode(CDNode *gnode) {
            auto *nd = &Ap.createNode();
            _mapping[gnode] = nd;
            _rev_mapping[nd] = gnode;
            return nd;
        }